

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

ER __thiscall
slang::ast::ForeachLoopStatement::evalRecursive
          (ForeachLoopStatement *this,EvalContext *context,ConstantValue *cv,
          span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims)

{
  SVQueue *pSVar1;
  _Map_pointer ppCVar2;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_00;
  bool bVar3;
  ER EVar4;
  ER EVar5;
  uint uVar6;
  int32_t iVar7;
  ER EVar8;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  variant_alternative_t<7UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar10;
  _Base_ptr p_Var11;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar12;
  reference cv_00;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar13;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar14;
  pointer pLVar15;
  EvalContext *pEVar16;
  ulong uVar17;
  _Rb_tree_header *p_Var18;
  void *pvVar19;
  __extent_storage<18446744073709551615UL> _Var20;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar21;
  int iVar22;
  ConstantRange CVar23;
  bool bVar24;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_01;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_02;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_03;
  undefined1 local_101;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_100;
  uint local_f8;
  undefined2 local_f4;
  EvalContext *local_f0;
  __extent_storage<18446744073709551615UL> local_e8;
  ForeachLoopStatement *local_e0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_d8;
  undefined1 local_b8;
  ConstantValue *local_b0;
  pointer local_a8;
  ConstantValue *local_a0;
  long local_98;
  __extent_storage<18446744073709551615UL> local_90;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> *local_88;
  pointer local_80;
  void *local_78;
  pointer local_70;
  __extent_storage<18446744073709551615UL> local_68;
  long local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  _Var20 = currDims._M_extent._M_extent_value;
  pLVar15 = currDims._M_ptr;
  if (pLVar15->loopVar == (IteratorSymbol *)0x0) {
    local_b8 = 0;
    currDims_01._M_extent._M_extent_value = _Var20._M_extent_value - 1;
    currDims_01._M_ptr = pLVar15 + 1;
    EVar4 = evalRecursive(this,context,(ConstantValue *)&local_d8,currDims_01);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_d8);
    return EVar4;
  }
  local_58._M_index = '\0';
  local_a0 = EvalContext::createLocal
                       (context,(ValueSymbol *)pLVar15->loopVar,(ConstantValue *)&local_58);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  EVar8 = 0x4fb7ac;
  EVar4 = 0x4fb7ac;
  local_f0 = context;
  local_e8._M_extent_value = _Var20._M_extent_value;
  local_e0 = this;
  switch(*(__index_type *)
          ((long)&(cv->value).
                  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          + 0x20)) {
  case '\x05':
    pvVar9 = std::
             get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&cv->value);
    local_80 = (pvVar9->
               super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_98 = ((long)(pvVar9->
                      super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)local_80 >> 3) *
               -0x3333333333333333;
    goto LAB_0043999a;
  case '\x06':
    pvVar13 = std::
              get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    bVar24 = pvVar13->_M_string_length != 0;
    if (bVar24) {
      bVar24 = true;
      aVar21.val = 0;
      do {
        local_f8 = 0x20;
        local_f4 = 1;
        local_100 = aVar21;
        SVInt::clearUnusedBits((SVInt *)&local_100);
        local_d8._0_8_ = local_100;
        local_d8._8_4_ = local_f8;
        local_d8._12_1_ = (undefined1)local_f4;
        local_d8._13_1_ = local_f4._1_1_;
        if (0x40 < local_f8 || (local_f4 & 0x100) != 0) {
          local_100.val = 0;
        }
        local_b8 = 1;
        local_b0 = local_a0;
        std::operator=(&local_b0,&local_d8,&local_101);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_d8);
        if (((0x40 < local_f8) || ((local_f4 & 0x100) != 0)) &&
           ((void *)local_100.val != (void *)0x0)) {
          operator_delete__(local_100.pVal);
        }
        EVar5 = Statement::eval(local_e0->body,context);
        if ((EVar5 == Continue) || (uVar17 = (ulong)EVar5, EVar5 == Success)) {
          uVar17 = _Var20._M_extent_value & 0xffffffff;
        }
        EVar8 = (ER)uVar17;
        if ((EVar5 != Continue) && (EVar5 != Success)) break;
        aVar21.pVal = (uint64_t *)(aVar21.val + 1);
        bVar24 = aVar21.val < (void *)pvVar13->_M_string_length;
        _Var20._M_extent_value = uVar17;
      } while (bVar24);
    }
    if (bVar24) {
      return EVar8;
    }
    break;
  case '\a':
    pvVar10 = std::
              get<7ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    p_Var11 = (pvVar10->ptr->
              super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
              )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var18 = &(pvVar10->ptr->
               super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               )._M_t._M_impl.super__Rb_tree_header;
    bVar24 = (_Rb_tree_header *)p_Var11 == p_Var18;
    if (!bVar24) {
      local_e8._M_extent_value = _Var20._M_extent_value - 1;
      bVar24 = false;
      do {
        local_d8._0_8_ = local_a0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
          ::_S_vtable._M_arr[(long)(char)p_Var11[2]._M_color + 1]._M_data)
                  ((anon_class_8_1_8991fb9c_conflict *)&local_d8,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)(p_Var11 + 1));
        if (_Var20._M_extent_value < 2) {
          EVar8 = Statement::eval(local_e0->body,local_f0);
        }
        else {
          currDims_02._M_extent._M_extent_value = local_e8._M_extent_value;
          currDims_02._M_ptr = pLVar15 + 1;
          EVar8 = evalRecursive(local_e0,local_f0,(ConstantValue *)&p_Var11[2]._M_parent,currDims_02
                               );
        }
        if ((EVar8 == Continue) || (pEVar16 = (EvalContext *)(ulong)EVar8, EVar8 == Success)) {
          pEVar16 = (EvalContext *)((ulong)context & 0xffffffff);
        }
        EVar4 = (ER)pEVar16;
        if ((EVar8 != Continue) && (EVar8 != Success)) break;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        bVar24 = (_Rb_tree_header *)p_Var11 == p_Var18;
        context = pEVar16;
      } while (!bVar24);
    }
    if (!bVar24) {
      return EVar4;
    }
    break;
  case '\b':
    pvVar12 = std::
              get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    pSVar1 = pvVar12->ptr;
    local_88 = &(pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Deque_impl_data._M_start;
    local_90._M_extent_value = _Var20._M_extent_value - 1;
    local_a8 = pLVar15 + 1;
    for (aVar21.val = 0;
        ppCVar2 = (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                  .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,
        pvVar19 = (void *)(((long)(pSVar1->
                                  super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ).
                                  super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)(pSVar1->
                                  super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ).
                                  super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                           -0x3333333333333333 +
                          ((long)(pSVar1->
                                 super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ).
                                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(pSVar1->
                                 super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ).
                                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                          -0x3333333333333333 +
                          (((long)ppCVar2 -
                            (long)(pSVar1->
                                  super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ).
                                  super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                          (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 0xc), aVar21.val < pvVar19;
        aVar21.pVal = (uint64_t *)(aVar21.val + 1)) {
      local_f8 = 0x20;
      local_f4 = 1;
      local_100 = aVar21;
      SVInt::clearUnusedBits((SVInt *)&local_100);
      local_d8._0_8_ = local_100;
      local_d8._8_4_ = local_f8;
      local_d8._12_1_ = (undefined1)local_f4;
      local_d8._13_1_ = local_f4._1_1_;
      if (0x40 < local_f8 || (local_f4 & 0x100) != 0) {
        local_100.val = 0;
      }
      local_b8 = 1;
      local_b0 = local_a0;
      std::operator=(&local_b0,&local_d8,&local_101);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_d8);
      if (((0x40 < local_f8) || ((local_f4 & 0x100) != 0)) && ((void *)local_100.val != (void *)0x0)
         ) {
        operator_delete__(local_100.pVal);
      }
      if (local_e8._M_extent_value < 2) {
        EVar4 = Statement::eval(local_e0->body,local_f0);
      }
      else {
        cv_00 = std::
                _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                ::operator[](local_88,aVar21.val);
        currDims_03._M_extent._M_extent_value = local_90._M_extent_value;
        currDims_03._M_ptr = local_a8;
        EVar4 = evalRecursive(local_e0,local_f0,cv_00,currDims_03);
      }
      if ((EVar4 == Continue) || (pEVar16 = (EvalContext *)(ulong)EVar4, EVar4 == Success)) {
        pEVar16 = (EvalContext *)((ulong)context & 0xffffffff);
      }
      EVar8 = (ER)pEVar16;
      if ((EVar4 != Continue) && (EVar4 != Success)) goto LAB_00439c09;
      context = pEVar16;
    }
    EVar8 = (ER)context;
LAB_00439c09:
    if (aVar21.val < pvVar19) {
      return EVar8;
    }
    break;
  default:
    local_98 = 0;
    local_80 = (pointer)0x0;
LAB_0043999a:
    if ((pLVar15->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
      CVar23 = (pLVar15->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value;
      uVar6 = CVar23.right;
      bVar24 = (int)uVar6 <= CVar23.left;
    }
    else {
      uVar6 = (int)local_98 - 1;
      CVar23.left = 0;
      CVar23.right = 0;
      bVar24 = false;
    }
    iVar22 = CVar23.left;
    EVar4 = (ER)((int)uVar6 <= iVar22);
    bVar3 = iVar22 <= (int)uVar6;
    if (bVar24) {
      bVar3 = (int)uVar6 <= iVar22;
    }
    if (bVar3) {
      local_78 = (void *)((ulong)uVar6 | (long)CVar23 << 0x20);
      local_68._M_extent_value = _Var20._M_extent_value - 1;
      local_70 = pLVar15 + 1;
      aVar21 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar22;
      local_90._M_extent_value = -(ulong)bVar24 | 1;
      local_60 = (long)(int)uVar6;
      bVar3 = true;
      local_a8 = pLVar15;
      do {
        local_f8 = 0x20;
        local_f4 = 1;
        local_100 = aVar21;
        SVInt::clearUnusedBits((SVInt *)&local_100);
        local_d8._0_8_ = local_100;
        local_d8._8_4_ = local_f8;
        local_d8._12_1_ = (undefined1)local_f4;
        local_d8._13_1_ = local_f4._1_1_;
        if (0x40 < local_f8 || (local_f4 & 0x100) != 0) {
          local_100.val = 0;
        }
        local_b8 = 1;
        local_b0 = local_a0;
        std::operator=(&local_b0,&local_d8,&local_101);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_d8);
        if (((0x40 < local_f8) || ((local_f4 & 0x100) != 0)) &&
           ((void *)local_100.val != (void *)0x0)) {
          operator_delete__(local_100.pVal);
        }
        if (local_e8._M_extent_value < 2) {
          EVar8 = Statement::eval(this->body,local_f0);
        }
        else {
          aVar14 = aVar21;
          if ((local_a8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
            local_d8._0_8_ = local_78;
            iVar7 = ConstantRange::translateIndex((ConstantRange *)&local_d8,CVar23.left);
            aVar14 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar7;
          }
          if (local_98 == 0) {
            local_b8 = 0;
          }
          else {
            std::__detail::__variant::
            _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_d8,
                              (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)(local_80 + aVar14.val));
          }
          currDims_00._M_extent._M_extent_value = local_68._M_extent_value;
          currDims_00._M_ptr = local_70;
          EVar8 = evalRecursive(this,local_f0,(ConstantValue *)&local_d8,currDims_00);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_d8);
        }
        if ((EVar8 == Continue) || (EVar4 = EVar8, EVar8 == Success)) {
          EVar4 = (ER)local_88;
        }
        if ((EVar8 != Continue) && (EVar8 != Success)) break;
        aVar21.val = aVar21.val + local_90._M_extent_value;
        bVar3 = (long)aVar21.val <= local_60;
        if (bVar24) {
          bVar3 = local_60 <= (long)aVar21.val;
        }
        CVar23.left = CVar23.left + (int)local_90._M_extent_value;
        CVar23.right = 0;
        local_88 = (_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                    *)CONCAT44(local_88._4_4_,EVar4);
        this = local_e0;
      } while (bVar3);
    }
    if (bVar3) {
      return EVar4;
    }
  }
  return Success;
}

Assistant:

ER ForeachLoopStatement::evalRecursive(EvalContext& context, const ConstantValue& cv,
                                       std::span<const LoopDim> currDims) const {
    // If there is no loop var just skip this index.
    auto& dim = currDims[0];
    if (!dim.loopVar) {
        // Shouldn't ever be at the end here.
        return evalRecursive(context, nullptr, currDims.subspan(1));
    }

    auto local = context.createLocal(dim.loopVar);

    // If this is an associative array, looping happens over the keys.
    if (cv.isMap()) {
        auto& map = *cv.map();
        for (auto& [key, val] : map) {
            *local = key;

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, val, currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isQueue()) {
        auto& q = *cv.queue();
        for (size_t i = 0; i < q.size(); i++) {
            *local = SVInt(32, i, true);

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, q[i], currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isString()) {
        SLANG_ASSERT(currDims.size() == 1);

        auto& str = cv.str();
        for (size_t i = 0; i < str.size(); i++) {
            *local = SVInt(32, i, true);

            ER result = body.eval(context);
            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else {
        std::span<const ConstantValue> elements;
        if (cv.isUnpacked())
            elements = cv.elements();

        ConstantRange range;
        bool isLittleEndian;
        if (dim.range) {
            range = *dim.range;
            isLittleEndian = range.isLittleEndian();
        }
        else {
            range = {0, int32_t(elements.size()) - 1};
            isLittleEndian = false;
        }

        for (int32_t i = range.left; isLittleEndian ? i >= range.right : i <= range.right;
             isLittleEndian ? i-- : i++) {

            *local = SVInt(32, uint64_t(i), true);

            ER result;
            if (currDims.size() > 1) {
                size_t index = size_t(i);
                if (dim.range)
                    index = (size_t)range.reverse().translateIndex(i);

                result = evalRecursive(context, elements.empty() ? nullptr : elements[index],
                                       currDims.subspan(1));
            }
            else {
                result = body.eval(context);
            }

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}